

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

int __thiscall libchars::editor::print(editor *this)

{
  size_t *psVar1;
  terminal_driver *ptVar2;
  double dVar3;
  editor *peVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  debug *pdVar8;
  ulong uVar9;
  edit_object *peVar10;
  ulong uVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong uVar12;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  size_t sVar13;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  size_t in_RCX;
  size_t __n;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  size_t local_80;
  size_t x;
  size_t y;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  editor *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_05;
  undefined4 extraout_var_08;
  
  this->state = IDLE;
  peVar10 = this->obj;
  if (peVar10->mode == MODE_MULTILINE) {
    if (peVar10->prompt_rendered == 0) {
      terminal_driver::write
                (this->driver,(int)(peVar10->prompt)._M_dataplus._M_p,
                 (void *)(peVar10->prompt)._M_string_length,in_RCX);
      peVar10 = this->obj;
      peVar10->prompt_rendered = (peVar10->prompt)._M_string_length;
    }
    uVar15 = peVar10->cursor;
    pvVar14 = (void *)(peVar10->insert_idx - uVar15);
    if (peVar10->insert_idx < uVar15 || pvVar14 == (void *)0x0) {
      return 0;
    }
    terminal_driver::write(this->driver,(int)peVar10 + (int)uVar15 + 8,pvVar14,uVar15);
    this->obj->cursor = this->obj->insert_idx;
    return 0;
  }
  ptVar2 = this->driver;
  local_50 = this;
  if (ptVar2->control_enabled == false) {
    if (peVar10->prompt_rendered == 0) {
      terminal_driver::write
                (ptVar2,(int)(peVar10->prompt)._M_dataplus._M_p,
                 (void *)(peVar10->prompt)._M_string_length,in_RCX);
      peVar10 = this->obj;
      peVar10->prompt_rendered = (peVar10->prompt)._M_string_length;
    }
    uVar15 = peVar10->cursor;
    if (peVar10->insert_idx <= uVar15) {
      return 0;
    }
    if (peVar10->buflen < uVar15) {
      uVar15 = peVar10->buflen;
    }
    iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar15);
    peVar4 = local_50;
    peVar10 = local_50->obj;
    uVar15 = peVar10->insert_idx + 1;
    if (peVar10->buflen < uVar15) {
      uVar15 = peVar10->buflen;
    }
    iVar6 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar15);
    sVar13 = CONCAT44(extraout_var_03,iVar6) - CONCAT44(extraout_var_02,iVar5);
    if (peVar4->obj->mode == MODE_PASSWORD) {
      sVar13 = 0;
    }
    if (CONCAT44(extraout_var_03,iVar6) <= CONCAT44(extraout_var_02,iVar5)) {
      sVar13 = 0;
    }
    sVar13 = render(peVar4,peVar4->obj->cursor,sVar13);
    psVar1 = &peVar4->obj->cursor;
    *psVar1 = *psVar1 + sVar13;
    return 0;
  }
  local_68 = ptVar2->t_cols;
  uVar15 = ptVar2->t_rows;
  if (uVar15 == 0 || local_68 == 0) {
    return -2;
  }
  if ((uVar15 | local_68) < 2) {
    return -3;
  }
  local_58 = uVar15 * local_68 - 1;
  uVar15 = peVar10->insert_idx;
  if (peVar10->buflen < peVar10->insert_idx) {
    uVar15 = peVar10->buflen;
  }
  iVar5 = (*peVar10->_vptr_edit_object[0xd])(peVar10,uVar15);
  peVar4 = local_50;
  uVar9 = CONCAT44(extraout_var,iVar5);
  peVar10 = local_50->obj;
  uVar15 = peVar10->insert_idx;
  if (peVar10->buflen < peVar10->insert_idx) {
    uVar15 = peVar10->buflen;
  }
  iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar15);
  peVar10 = peVar4->obj;
  uVar15 = peVar10->insert_idx + 1;
  if (peVar10->buflen < uVar15) {
    uVar15 = peVar10->buflen;
  }
  iVar6 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar15);
  peVar10 = peVar4->obj;
  if (peVar10->mode == MODE_PASSWORD) {
    local_38 = 0;
  }
  else {
    iVar7 = (*peVar10->_vptr_edit_object[0xc])(peVar10,peVar10->buflen);
    local_38 = CONCAT44(extraout_var_04,iVar7);
  }
  uVar15 = local_58;
  local_40 = CONCAT44(extraout_var_00,iVar5);
  if (uVar9 < CONCAT44(extraout_var_00,iVar5)) {
    local_40 = uVar9;
  }
  uVar18 = CONCAT44(extraout_var_01,iVar6);
  if (CONCAT44(extraout_var_01,iVar6) <= local_40) {
    uVar18 = local_40;
  }
  if (local_58 < uVar9 - local_40) {
    uVar9 = local_40;
  }
  pdVar8 = debug::initialize(0);
  uVar16 = local_38;
  uVar11 = local_40;
  uVar12 = local_68;
  y = uVar18;
  local_48 = uVar9;
  debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  peVar4 = local_50;
  if (uVar15 < (local_50->obj->prompt)._M_string_length + uVar16) {
    if (uVar16 == 0) {
      uVar18 = 0;
      uVar15 = 0;
      uVar9 = 0;
    }
    else {
      if (y - uVar11 < uVar15) {
        uVar9 = uVar15 >> 1;
        if (uVar9 < uVar16 - local_48) {
          uVar18 = 0;
          if (uVar9 <= local_48) {
            uVar18 = local_48 - uVar9;
          }
        }
        else {
          uVar18 = 0;
          if (uVar15 <= uVar16) {
            uVar18 = uVar16 - uVar15;
          }
        }
        pdVar8 = debug::initialize(0);
        dVar3 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
        uVar9 = uVar11 - uVar18;
        if (uVar11 < uVar18 || uVar9 == 0) {
          uVar15 = peVar4->obj->insert_idx;
          uVar16 = local_38;
        }
        else {
          peVar10 = peVar4->obj;
          local_40 = peVar10->insert_idx;
          uVar15 = 0;
          if (uVar9 <= local_40) {
            uVar15 = local_40 - uVar9;
          }
          uVar12 = peVar10->buflen;
          if (uVar15 <= peVar10->buflen) {
            uVar12 = uVar15;
          }
          iVar5 = (*peVar10->_vptr_edit_object[0xc])(SUB84(dVar3,0),peVar10,uVar12);
          uVar16 = local_38;
          uVar11 = CONCAT44(extraout_var_05,iVar5);
          if (uVar18 < uVar11) {
            if (uVar9 < local_40) {
              if (local_40 < uVar9) {
                uVar9 = local_40;
              }
              uVar9 = ~uVar9 + local_40;
              do {
                uVar15 = uVar9;
                peVar10 = peVar4->obj;
                uVar9 = peVar10->buflen;
                if (uVar15 <= peVar10->buflen) {
                  uVar9 = uVar15;
                }
                iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar9);
                uVar11 = CONCAT44(extraout_var_06,iVar5);
              } while ((uVar15 != 0) && (uVar9 = uVar15 - 1, uVar18 < uVar11));
            }
            uVar16 = local_38;
            if (uVar11 < uVar18) {
              uVar15 = uVar15 + 1;
              peVar10 = peVar4->obj;
              uVar9 = peVar10->buflen;
              if (uVar15 <= peVar10->buflen) {
                uVar9 = uVar15;
              }
              iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar9);
              uVar11 = CONCAT44(extraout_var_07,iVar5);
              uVar16 = local_38;
            }
          }
          else if ((uVar11 < uVar18) && (peVar10 = peVar4->obj, uVar15 < peVar10->insert_idx)) {
            do {
              uVar15 = uVar15 + 1;
              uVar9 = peVar10->buflen;
              if (uVar15 <= peVar10->buflen) {
                uVar9 = uVar15;
              }
              iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar9);
              uVar11 = CONCAT44(extraout_var_13,iVar5);
            } while ((uVar11 < uVar18) && (peVar10 = peVar4->obj, uVar15 < peVar10->insert_idx));
          }
        }
      }
      else {
        uVar15 = local_50->obj->insert_idx;
      }
      pdVar8 = debug::initialize(0);
      dVar3 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      local_68 = local_58 + uVar11;
      if (local_68 < uVar16) {
        uVar16 = local_68;
      }
      peVar10 = peVar4->obj;
      uVar9 = peVar10->insert_idx;
      if (peVar10->insert_idx <= uVar15) {
        uVar9 = uVar15;
      }
      uVar18 = uVar9 + 1;
      if (peVar10->buflen < uVar9 + 1) {
        uVar18 = peVar10->buflen;
      }
      local_60 = uVar15;
      local_40 = uVar11;
      iVar5 = (*peVar10->_vptr_edit_object[0xc])(SUB84(dVar3,0),peVar10,uVar18);
      uVar12 = CONCAT44(extraout_var_08,iVar5);
      pdVar8 = debug::initialize(0);
      sVar13 = y;
      dVar3 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      lVar17 = uVar16 - sVar13;
      uVar15 = local_60;
      uVar9 = local_40;
      local_38 = uVar16;
      if (sVar13 <= uVar16 && lVar17 != 0) {
        peVar10 = peVar4->obj;
        uVar18 = lVar17 + peVar10->insert_idx;
        uVar15 = peVar10->buflen;
        if (uVar15 < uVar18) {
          uVar18 = uVar15;
        }
        uVar9 = uVar18 + 1;
        if (uVar15 < uVar18 + 1) {
          uVar9 = uVar15;
        }
        iVar5 = (*peVar10->_vptr_edit_object[0xc])(SUB84(dVar3,0),peVar10,uVar9);
        uVar9 = local_40;
        uVar15 = local_60;
        uVar12 = CONCAT44(extraout_var_09,iVar5);
        if (uVar12 < local_38) {
          peVar10 = peVar4->obj;
          uVar11 = peVar10->buflen;
          uVar16 = uVar18;
          if (uVar18 < uVar11) {
            do {
              uVar18 = uVar16 + 1;
              uVar12 = uVar16 + 2;
              if (uVar11 < uVar16 + 2) {
                uVar12 = uVar11;
              }
              iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar12);
              uVar12 = CONCAT44(extraout_var_10,iVar5);
              peVar10 = peVar4->obj;
              uVar11 = peVar10->buflen;
            } while ((uVar12 < local_38) && (uVar16 = uVar18, uVar18 < uVar11));
          }
          if ((local_38 < uVar12) && (peVar10->insert_idx < uVar18)) {
            local_38 = uVar18 - 1;
            if (uVar11 < uVar18) {
              uVar18 = uVar11;
            }
            iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar18);
            uVar12 = CONCAT44(extraout_var_11,iVar5);
          }
        }
        else if (local_38 < uVar12) {
          do {
            peVar10 = peVar4->obj;
            if (uVar18 <= peVar10->insert_idx) break;
            uVar12 = uVar18;
            if (peVar10->buflen < uVar18) {
              uVar12 = peVar10->buflen;
            }
            iVar5 = (*peVar10->_vptr_edit_object[0xc])(peVar10,uVar12);
            uVar12 = CONCAT44(extraout_var_12,iVar5);
            uVar18 = uVar18 - 1;
          } while (local_38 < uVar12);
        }
      }
      uVar11 = local_68;
      if (uVar12 - uVar9 <= local_58) {
        uVar11 = uVar12;
      }
      uVar18 = 0;
      if (uVar9 <= uVar12) {
        uVar18 = uVar11 - uVar9;
      }
      pdVar8 = debug::initialize(0);
      uVar9 = local_40;
      debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
    }
    ptVar2 = peVar4->driver;
    terminal_driver::cursor_disable(ptVar2);
    terminal_driver::clear_screen(peVar4->driver);
    pvVar14 = (void *)(local_58 - uVar18);
    if (local_58 < uVar18 || pvVar14 == (void *)0x0) {
      peVar4->obj->prompt_rendered = 0;
      uVar18 = local_58;
    }
    else {
      peVar10 = peVar4->obj;
      peVar10->prompt_rendered = (size_t)pvVar14;
      terminal_driver::write
                (peVar4->driver,
                 ((int)(peVar10->prompt)._M_dataplus._M_p + (int)(peVar10->prompt)._M_string_length)
                 - (int)pvVar14,pvVar14,local_58);
      pdVar8 = debug::initialize(0);
      debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
    }
    sVar13 = render(peVar4,uVar15,uVar18);
    pdVar8 = debug::initialize(0);
    debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
    iVar5 = terminal_driver::set_new_xy(peVar4->driver,local_48 - (uVar9 + sVar13));
    terminal_driver::cursor_enable(ptVar2);
    if (iVar5 < 0) {
      return -1;
    }
    if (uVar18 != 0) goto LAB_00110eea;
  }
  else {
    pdVar8 = debug::initialize(0);
    __n = 0x143;
    debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    iVar5 = terminal_driver::set_new_xy
                      (peVar4->driver,-(peVar4->obj->cursor + peVar4->obj->prompt_rendered));
    if (iVar5 < 0) {
      return -1;
    }
    terminal_driver::clear_to_end_of_screen(peVar4->driver);
    peVar10 = peVar4->obj;
    pvVar14 = (void *)(peVar10->prompt)._M_string_length;
    if (pvVar14 == (void *)0x0) {
      sVar13 = 0;
    }
    else {
      terminal_driver::write(peVar4->driver,(int)(peVar10->prompt)._M_dataplus._M_p,pvVar14,__n);
      pdVar8 = debug::initialize(0);
      debug::log(pdVar8,(double)peVar4->obj->cursor);
      peVar10 = peVar4->obj;
      peVar10->cursor = 0;
      sVar13 = (peVar10->prompt)._M_string_length;
    }
    peVar4 = local_50;
    peVar10->prompt_rendered = sVar13;
    if (uVar16 != 0) {
      ptVar2 = local_50->driver;
      terminal_driver::cursor_disable(ptVar2);
      sVar13 = render(peVar4,0,uVar16);
      pdVar8 = debug::initialize(0);
      debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((peVar4->obj->prompt_rendered + sVar13) % uVar12 == 0) {
        terminal_driver::newline(peVar4->driver);
      }
      iVar5 = terminal_driver::set_new_xy(peVar4->driver,local_48 - sVar13);
      terminal_driver::cursor_enable(ptVar2);
      if (iVar5 < 0) {
        return -1;
      }
      goto LAB_00110eea;
    }
  }
  local_48 = 0;
LAB_00110eea:
  peVar4 = local_50;
  local_50->obj->cursor = local_48;
  pdVar8 = debug::initialize(0);
  if ((3 < pdVar8->log_level) && (peVar4->driver->control_enabled == true)) {
    terminal_driver::cursor_position(peVar4->driver,&local_80,&x,-1);
    pdVar8 = debug::initialize(0);
    debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
  }
  return 0;
}

Assistant:

int editor::print()
    {
        state = IDLE;

        if (obj->mode == MODE_MULTILINE) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // print from previous cursor up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t n_to_write = (obj->insert_idx - obj->cursor);
                driver.write(obj->data() + obj->cursor, n_to_write);
                obj->cursor = obj->insert_idx;
            }
        }
        else if (!driver.control()) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // render from previous position up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t start = obj->terminal_idx(obj->idx(obj->cursor));
                size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));
                size_t render_length = (obj->mode == MODE_PASSWORD || end <= start) ? 0 : (end - start);
                obj->cursor += render(obj->cursor,render_length);
            }
        } 
        else {
          size_t cols = driver.columns();
          size_t rows = driver.rows();

          // invalid: no rows or columns
          if (cols == 0 || rows == 0)
              return -2;
          // do nothing if only 1 position available (1 x 1 terminal)
          if (cols <= 1 && rows <= 1)
              return -3;

          // calculate available terminal space (leave extra space at the end for the cursor to overflow into)
          size_t window = cols * rows - 1;

          // dump will be limited depending on available terminal space;
          // prompt will be shortened if terminal not big enough for full string

          size_t cursor = obj->terminal_cursor(obj->idx(obj->insert_idx));
          size_t start = obj->terminal_idx(obj->idx(obj->insert_idx));
          size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));

          size_t render_length = (obj->mode == MODE_PASSWORD) ? 0 : obj->terminal_idx(obj->idx(obj->length()));

          if (cursor < start)
              start = cursor;
          if (end < start)
              end = start;
          if ((cursor - start) > window)
              cursor = start;

          LC_LOG_VERBOSE("window[%zu:%zux%zu];start[%zu];cursor[%zu];end[%zu];render_len[%zu]",window,cols,rows,start,cursor,end,render_length);

          if ((render_length + obj->prompt.length()) > window) {
              size_t idx_from = 0;
              size_t from = 0;
              if (render_length > 0) {
                  if ((end - start) >= window) {
                      idx_from = obj->insert_idx;
                      from = start;
                  }
                  else {
                      size_t search_from = 0;
                      if ((render_length - cursor) <= window/2) { // <-- cursor in last 1/2 window
                          // find all complete expanded characters that fit into (window - (LENGTH - START)) before START
                          if (render_length > window)
                              search_from = render_length - window;
                          else
                              search_from = 0;
                      }
                      else if (cursor < window/2) { // <-- cursor in first 1/2 window
                          // find all complete expanded characters that fit into space before START
                          search_from = 0;
                      }
                      else {
                          search_from = cursor - window/2;
                      }
                      LC_LOG_VERBOSE("search_from[%zu];start[%zu]",search_from,start);

                      if (search_from < start) {
                          // start searching with assumption that render is 1:1 with buffer
                          size_t space = start - search_from;
                          if (space < obj->insert_idx)
                              idx_from = obj->insert_idx - space;
                          else
                              idx_from = 0;
                          // keep on comparing until rendered string fits in or until space runs out
                          from = obj->terminal_idx(obj->idx(idx_from));
                          if (from > search_from) {
                              // more space available; search backwards
                              while (idx_from > 0 && from > search_from) {
                                  --idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                              if (from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                          else if (from < search_from) {
                              // used too much space; search forwards
                              while (idx_from < obj->insert_idx && from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                      }
                      else {
                          idx_from = obj->insert_idx;
                          from = start;
                      }
                  }

                  LC_LOG_VERBOSE("from[%zu];idx_from[%zu]",from,idx_from);

                  // find all expanded characters (even partial) that fit into (window - END) on and after END
                  size_t search_to = from + window;
                  if (search_to > render_length)
                      search_to = render_length;
                  size_t idx_to = obj->insert_idx;
                  if (idx_to < idx_from)
                      idx_to = idx_from;
                  size_t to = obj->terminal_idx(obj->idx(idx_to + 1));

                  LC_LOG_VERBOSE("search_to[%zu];end[%zu]",search_to,end);

                  if (search_to > end) {
                      // start searching with assumption that render is 1:1 with buffer
                      idx_to = obj->idx(obj->insert_idx + (search_to - end));
                      // keep on comparing until rendered string fits in or until space runs out
                      to = obj->terminal_idx(obj->idx(idx_to + 1));
                      if (to < search_to) {
                          // more space available; search forwards
                          while (idx_to < obj->length() && to < search_to) {
                              ++idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                          if (to > search_to && idx_to > obj->insert_idx) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                      else if (to > search_to) {
                          // used too much space; search backwards
                          while (idx_to > obj->insert_idx && to > search_to) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                  }

                  LC_LOG_VERBOSE("to[%zu];idx_to[%zu]",to,idx_to);

                  if (to < from)
                      to = from;
                  else if ((to - from) > window)
                      to = from + window;

                  render_length = to - from;
              }

              // start printing in upper-left corner
              terminal_driver::auto_cursor __(driver);
              driver.clear_screen();

              // print partial prompt (if possible)
              if (render_length < window) {
                  obj->prompt_rendered = window - render_length;
                  driver.write(obj->prompt.data() + obj->prompt.length() - obj->prompt_rendered, obj->prompt_rendered);
                  LC_LOG_VERBOSE("prompt_rendered[%zu]:%s",obj->prompt_rendered,obj->prompt.c_str()+obj->prompt.length()-obj->prompt_rendered);
              }
              else {
                  obj->prompt_rendered = 0;
                  render_length = window;
              }

              // print line[idx_from..]
              size_t rendered = render(idx_from, render_length);
              // move to final cursor position (relative to current position)
              LC_LOG_VERBOSE("cursor[%zu];from[%zu];rendered[%zu]",cursor,from,rendered);
              if (driver.set_new_xy((ssize_t)cursor - (ssize_t)(from + rendered)) < 0)
                  return -1;
          }
          else {
              LC_LOG_VERBOSE("obj->cursor[%zu]",obj->cursor);

              // move cursor to start of prompt position (relative to current position)
              if (driver.set_new_xy(0 - (ssize_t)obj->cursor - (ssize_t)obj->prompt_rendered) < 0)
                  return -1;

              // clear area for printing (TODO: optimize by only clearing specific lines)
              driver.clear_to_end_of_screen();

              // render prompt
              if (obj->prompt.length() > 0) {
                  driver.write(obj->prompt.data(), obj->prompt.length());
                  LC_LOG_VERBOSE("cursor[%zu];prompt_rendered[%zu]",obj->cursor,obj->prompt_rendered);
                  obj->cursor = 0;
              }
              obj->prompt_rendered = obj->prompt.length();

              if (render_length > 0) {
                  // print line
                  terminal_driver::auto_cursor __(driver);
                  size_t rendered = render(0, render_length);
                  LC_LOG_VERBOSE("rendered[%zu]",rendered);

                  // hack to convince cursor to move to the start of the next line
                  // on a fully populated rendered line
                  if (((obj->prompt_rendered + rendered) % cols) == 0)
                      driver.newline();

                  // move to final cursor position (relative to current position)
                  if (driver.set_new_xy((ssize_t)cursor - (ssize_t)rendered) < 0)
                      return -1;
              }
          }

          obj->cursor = (render_length > 0) ? cursor : 0;

          if (LC_LOG_CHECK_LEVEL(debug::VERBOSE) && driver.control()) {
              size_t x,y;
              driver.cursor_position(x,y);
              LC_LOG_VERBOSE("obj->cursor[%zu];x[%zu],y[%zu]",obj->cursor,x,y);
          }
        }

        return 0;
    }